

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderMatrixTests.cpp
# Opt level: O1

void deqp::gles2::Functional::MatrixCaseUtils::Evaluator<1,_2,_9,_0,_9>::evaluate
               (ShaderEvalContext *evalCtx)

{
  undefined8 uVar1;
  int i;
  float *pfVar2;
  long lVar3;
  undefined4 *puVar4;
  int row;
  long lVar5;
  long lVar6;
  undefined4 uVar7;
  Vector<float,_3> res;
  Vector<float,_3> res_1;
  Mat3 m;
  Vec4 *local_b0;
  undefined8 local_a8;
  float local_a0 [6];
  Matrix<float,_3,_3> local_88;
  Matrix<float,_3,_3> local_5c;
  Matrix<float,_3,_3> local_38;
  
  pfVar2 = (float *)&local_88;
  lVar3 = 0;
  lVar5 = 0;
  do {
    lVar6 = 0;
    do {
      uVar7 = 0x3f800000;
      if (lVar3 != lVar6) {
        uVar7 = 0;
      }
      *(undefined4 *)((long)pfVar2 + lVar6) = uVar7;
      lVar6 = lVar6 + 0xc;
    } while (lVar6 != 0x24);
    lVar5 = lVar5 + 1;
    pfVar2 = pfVar2 + 1;
    lVar3 = lVar3 + 0xc;
  } while (lVar5 != 3);
  local_88.m_data.m_data[0].m_data._0_8_ = *(undefined8 *)evalCtx->in[0].m_data;
  local_88.m_data.m_data[0].m_data[2] = evalCtx->in[0].m_data[2];
  uVar1 = *(undefined8 *)evalCtx->in[1].m_data;
  local_88.m_data.m_data[1].m_data[2] = evalCtx->in[1].m_data[2];
  local_88.m_data.m_data[1].m_data[0] = (float)uVar1;
  local_88.m_data.m_data[1].m_data[1] = (float)((ulong)uVar1 >> 0x20);
  local_88.m_data.m_data[2].m_data._0_8_ = *(undefined8 *)evalCtx->in[2].m_data;
  local_88.m_data.m_data[2].m_data[2] = evalCtx->in[2].m_data[2];
  pfVar2 = (float *)&local_38;
  local_38.m_data.m_data[1].m_data[1] = 0.0;
  local_38.m_data.m_data[1].m_data[2] = 0.0;
  local_38.m_data.m_data[2].m_data[0] = 0.0;
  local_38.m_data.m_data[2].m_data[1] = 0.0;
  local_38.m_data.m_data[0].m_data[0] = 0.0;
  local_38.m_data.m_data[0].m_data[1] = 0.0;
  local_38.m_data.m_data[0].m_data[2] = 0.0;
  local_38.m_data.m_data[1].m_data[0] = 0.0;
  local_38.m_data.m_data[2].m_data[2] = 0.0;
  puVar4 = &DAT_02292a54;
  lVar3 = 0;
  do {
    lVar5 = 0;
    do {
      *(undefined4 *)((long)pfVar2 + lVar5) = *(undefined4 *)((long)puVar4 + lVar5);
      lVar5 = lVar5 + 0xc;
    } while (lVar5 != 0x24);
    lVar3 = lVar3 + 1;
    pfVar2 = pfVar2 + 1;
    puVar4 = puVar4 + 1;
  } while (lVar3 != 3);
  tcu::operator-(&local_5c,&local_88,&local_38);
  local_a8 = (ulong)local_a8._4_4_ << 0x20;
  local_b0 = (Vec4 *)0x0;
  lVar3 = 0;
  do {
    *(float *)((long)&local_b0 + lVar3 * 4) =
         local_5c.m_data.m_data[0].m_data[lVar3] + local_5c.m_data.m_data[1].m_data[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  local_a0[4] = 0.0;
  local_a0[2] = 0.0;
  local_a0[3] = 0.0;
  lVar3 = 0;
  do {
    local_a0[lVar3 + 2] =
         *(float *)((long)&local_b0 + lVar3 * 4) +
         *(float *)((long)(local_38.m_data.m_data + -1) + lVar3 * 4);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  local_b0 = &evalCtx->color;
  local_a8 = 0x100000000;
  local_a0[0] = 2.8026e-45;
  lVar3 = 2;
  do {
    (evalCtx->color).m_data[*(int *)((long)&local_b0 + lVar3 * 4)] = local_a0[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx)
	{
		evalCtx.color.xyz() = reduceToVec3(getInputValue<In0Type, In0DataType>(evalCtx, 0) - getInputValue<In1Type, In1DataType>(evalCtx, 1));
	}